

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O0

void __thiscall board::Board::updateListMaterial(Board *this)

{
  int iVar1;
  int local_18;
  int i;
  int piece;
  Board *this_local;
  
  for (local_18 = 0; local_18 < 0x78; local_18 = local_18 + 1) {
    iVar1 = this->board[local_18];
    if ((iVar1 != 99) && (iVar1 != 0)) {
      this->pList[iVar1][this->pNum[iVar1]] = local_18;
      this->pNum[iVar1] = this->pNum[iVar1] + 1;
      this->material[PIECE_COLOR[iVar1]] = PIECE_VAL[iVar1] + this->material[PIECE_COLOR[iVar1]];
      if (iVar1 == 1) {
        bitboard::setBit(this->pawns,SQ64[local_18]);
        bitboard::setBit(this->pawns + 2,SQ64[local_18]);
      }
      else if (iVar1 == 7) {
        bitboard::setBit(this->pawns + 1,SQ64[local_18]);
        bitboard::setBit(this->pawns + 2,SQ64[local_18]);
      }
    }
  }
  return;
}

Assistant:

void board::Board::updateListMaterial()
{
    int piece;
    for (int i = 0; i < 120; i++) {
        piece = board[i];
        if (piece != NO_SQ && piece != EMPTY) {
            pList[piece][pNum[piece]] = i;
            pNum[piece]++;
            material[PIECE_COLOR[piece]] += PIECE_VAL[piece];
            if (piece == WP) {
                board::bitboard::setBit(pawns[WHITE], SQ64[i]);
                board::bitboard::setBit(pawns[BOTH], SQ64[i]);
            }
            else if (piece == BP) {
                board::bitboard::setBit(pawns[BLACK], SQ64[i]);
                board::bitboard::setBit(pawns[BOTH], SQ64[i]);
            }
        }
    }
}